

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb_swap(void *p,void *q,size_t sz)

{
  undefined4 uVar1;
  undefined8 uVar2;
  void *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  stb__8 temp_1;
  stb__4 temp;
  char buffer [256];
  undefined1 local_118 [248];
  size_t in_stack_ffffffffffffffe0;
  undefined8 *local_8;
  
  if (in_RDI != in_RSI) {
    if (in_RDX == (void *)0x4) {
      uVar1 = *(undefined4 *)in_RDI;
      *(undefined4 *)in_RDI = *(undefined4 *)in_RSI;
      *(undefined4 *)in_RSI = uVar1;
    }
    else {
      local_8 = in_RDI;
      if (in_RDX == (void *)0x8) {
        uVar2 = *in_RDI;
        *in_RDI = *in_RSI;
        *in_RSI = uVar2;
      }
      else {
        for (; (void *)0x100 < in_RDX; in_RDX = (void *)((long)in_RDX + -0x100)) {
          stb_swap(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
          local_8 = local_8 + 0x20;
          in_RSI = in_RSI + 0x20;
        }
        SDL_memcpy(local_118,local_8,in_RDX);
        SDL_memcpy(local_8,in_RSI,in_RDX);
        SDL_memcpy(in_RSI,local_118,in_RDX);
      }
    }
  }
  return;
}

Assistant:

void stb_swap(void *p, void *q, size_t sz)
{
   char buffer[256];
   if (p == q) return;
   if (sz == 4) {
      stb__4 temp    = * ( stb__4 *) p;
      * (stb__4 *) p = * ( stb__4 *) q;
      * (stb__4 *) q = temp;
      return;
   } else if (sz == 8) {
      stb__8 temp    = * ( stb__8 *) p;
      * (stb__8 *) p = * ( stb__8 *) q;
      * (stb__8 *) q = temp;
      return;
   }

   while (sz > sizeof(buffer)) {
      stb_swap(p, q, sizeof(buffer));
      p = (char *) p + sizeof(buffer);
      q = (char *) q + sizeof(buffer);
      sz -= sizeof(buffer);
   }

   memcpy(buffer, p     , sz);
   memcpy(p     , q     , sz);
   memcpy(q     , buffer, sz);
}